

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::static_resources(static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *this,custom_functions<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                         *functions,allocator_type *alloc)

{
  pointer pcVar1;
  pointer *__ptr;
  pointer pcVar2;
  _Storage<unsigned_long,_true> local_48;
  _Any_data local_40;
  
  static_resources(this,alloc);
  pcVar1 = (functions->functions_).
           super__Vector_base<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pcVar2 = (functions->functions_).
                super__Vector_base<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 0x50)
  {
    local_40._M_unused._0_8_ = (undefined8)*(undefined8 *)(pcVar2 + 0x20);
    local_40._M_pod_data[8] = (char)pcVar2[0x28];
    std::
    make_unique<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::optional<unsigned_long>,std::function<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>(jsoncons::detail::span<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const,18446744073709551615ul>,std::error_code&)>const&>
              ((optional<unsigned_long> *)&local_48,
               (function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(jsoncons::detail::span<const_jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_18446744073709551615UL>,_std::error_code_&)>
                *)&local_40);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::__cxx11::string_const&,std::unique_ptr<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::decorator_function<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->custom_functions_,pcVar2,&local_48);
    if ((long *)local_48._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  return;
}

Assistant:

static_resources(const custom_functions<Json>& functions, 
            const allocator_type& alloc = allocator_type())
            : static_resources(alloc)
        {
            for (const auto& item : functions)
            {
                custom_functions_.emplace(item.name(),
                                          jsoncons::make_unique<decorator_function<Json>>(item.arity(),item.function()));
            }
        }